

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O0

REF_STATUS ref_collapse_edge_ratio(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_NODE ref_node_00;
  uint uVar1;
  REF_INT local_124;
  double local_120;
  REF_DBL local_118;
  REF_DBL local_110;
  REF_DBL local_108;
  REF_INT local_fc;
  int local_f8;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL new_min;
  REF_DBL new_max;
  REF_DBL old_min;
  REF_DBL old_max;
  REF_DBL edge_ratio;
  REF_BOOL will_be_collapsed;
  REF_INT node;
  REF_INT nodes [27];
  REF_INT local_40;
  int local_3c;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_BOOL *allowed_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  *allowed = 0;
  if ((ref_grid->surf == 0) && (ref_grid->twod == 0)) {
    _cell = ref_grid->cell[8];
  }
  else {
    _cell = ref_grid->cell[3];
  }
  old_min = -1.0;
  new_max = 1e+200;
  new_min = -1.0;
  _ref_private_macro_code_rss_1 = 1e+200;
  if ((node1 < 0) || (_cell->ref_adj->nnode <= node1)) {
    local_f8 = -1;
  }
  else {
    local_f8 = _cell->ref_adj->first[node1];
  }
  local_3c = local_f8;
  if (local_f8 == -1) {
    local_fc = -1;
  }
  else {
    local_fc = _cell->ref_adj->item[local_f8].ref;
  }
  local_40 = local_fc;
  while( true ) {
    if (local_3c == -1) {
      if ((ref_grid->adapt->post_min_ratio <= _ref_private_macro_code_rss_1) &&
         (new_min <= ref_grid->adapt->post_max_ratio)) {
        *allowed = 1;
      }
      if ((new_max <= _ref_private_macro_code_rss_1) && (new_min <= old_min)) {
        *allowed = 1;
      }
      return 0;
    }
    uVar1 = ref_cell_nodes(_cell,local_40,&will_be_collapsed);
    if (uVar1 != 0) break;
    for (edge_ratio._4_4_ = 0; edge_ratio._4_4_ < _cell->node_per;
        edge_ratio._4_4_ = edge_ratio._4_4_ + 1) {
      if (node1 != (&will_be_collapsed)[edge_ratio._4_4_]) {
        uVar1 = ref_node_ratio(ref_node_00,node1,(&will_be_collapsed)[edge_ratio._4_4_],&old_max);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x37f,"ref_collapse_edge_ratio",(ulong)uVar1,"ratio");
          return uVar1;
        }
        if (old_min <= old_max) {
          local_108 = old_max;
        }
        else {
          local_108 = old_min;
        }
        old_min = local_108;
        if (old_max <= new_max) {
          local_110 = old_max;
        }
        else {
          local_110 = new_max;
        }
        new_max = local_110;
      }
    }
    edge_ratio._0_4_ = 0;
    for (edge_ratio._4_4_ = 0; edge_ratio._4_4_ < _cell->node_per;
        edge_ratio._4_4_ = edge_ratio._4_4_ + 1) {
      if (node0 == (&will_be_collapsed)[edge_ratio._4_4_]) {
        edge_ratio._0_4_ = 1;
      }
    }
    if (edge_ratio._0_4_ == 0) {
      for (edge_ratio._4_4_ = 0; edge_ratio._4_4_ < _cell->node_per;
          edge_ratio._4_4_ = edge_ratio._4_4_ + 1) {
        if (node1 != (&will_be_collapsed)[edge_ratio._4_4_]) {
          uVar1 = ref_node_ratio(ref_node_00,node0,(&will_be_collapsed)[edge_ratio._4_4_],&old_max);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0x38c,"ref_collapse_edge_ratio",(ulong)uVar1,"ratio");
            return uVar1;
          }
          if (new_min <= old_max) {
            local_118 = old_max;
          }
          else {
            local_118 = new_min;
          }
          new_min = local_118;
          if (old_max <= _ref_private_macro_code_rss_1) {
            local_120 = old_max;
          }
          else {
            local_120 = _ref_private_macro_code_rss_1;
          }
          _ref_private_macro_code_rss_1 = local_120;
        }
      }
    }
    local_3c = _cell->ref_adj->item[local_3c].next;
    if (local_3c == -1) {
      local_124 = -1;
    }
    else {
      local_124 = _cell->ref_adj->item[local_3c].ref;
    }
    local_40 = local_124;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",0x37b,
         "ref_collapse_edge_ratio",(ulong)uVar1,"nodes");
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_ratio(REF_GRID ref_grid, REF_INT node0,
                                           REF_INT node1, REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_BOOL will_be_collapsed;
  REF_DBL edge_ratio;
  REF_DBL old_max, old_min, new_max, new_min;

  *allowed = REF_FALSE;

  if (ref_grid_surf(ref_grid) || ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  old_max = -1.0;
  old_min = REF_DBL_MAX;
  new_max = -1.0;
  new_min = REF_DBL_MAX;
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node1 != nodes[node]) {
        RSS(ref_node_ratio(ref_node, node1, nodes[node], &edge_ratio), "ratio");
        old_max = MAX(old_max, edge_ratio);
        old_min = MIN(old_min, edge_ratio);
      }
    }

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 != nodes[node]) {
        RSS(ref_node_ratio(ref_node, node0, nodes[node], &edge_ratio), "ratio");
        new_max = MAX(new_max, edge_ratio);
        new_min = MIN(new_min, edge_ratio);
      }
  }

  if ((new_min >= ref_grid_adapt(ref_grid, post_min_ratio)) &&
      (new_max <= ref_grid_adapt(ref_grid, post_max_ratio))) {
    *allowed = REF_TRUE;
  }

  if (new_min >= old_min && new_max <= old_max) {
    *allowed = REF_TRUE;
  }

  return REF_SUCCESS;
}